

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

FileType duckdb::GetFileTypeInternal(int fd)

{
  int iVar1;
  FileType FVar2;
  uint uVar3;
  stat s;
  stat local_90;
  
  iVar1 = fstat(fd,&local_90);
  FVar2 = FILE_TYPE_INVALID;
  if ((iVar1 != -1) && (uVar3 = (local_90.st_mode & 0xf000) - 0x1000, uVar3 < 0xc000)) {
    FVar2 = *(FileType *)(&DAT_0133382c + (uVar3 >> 10));
  }
  return FVar2;
}

Assistant:

static FileType GetFileTypeInternal(int fd) { // LCOV_EXCL_START
	struct stat s;
	if (fstat(fd, &s) == -1) {
		return FileType::FILE_TYPE_INVALID;
	}
	switch (s.st_mode & S_IFMT) {
	case S_IFBLK:
		return FileType::FILE_TYPE_BLOCKDEV;
	case S_IFCHR:
		return FileType::FILE_TYPE_CHARDEV;
	case S_IFIFO:
		return FileType::FILE_TYPE_FIFO;
	case S_IFDIR:
		return FileType::FILE_TYPE_DIR;
	case S_IFLNK:
		return FileType::FILE_TYPE_LINK;
	case S_IFREG:
		return FileType::FILE_TYPE_REGULAR;
	case S_IFSOCK:
		return FileType::FILE_TYPE_SOCKET;
	default:
		return FileType::FILE_TYPE_INVALID;
	}
}